

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O2

void parameters_dump(parameters *P,void *usr,parameter_print_func f)

{
  (*f)(usr,"K",P->K);
  (*f)(usr,"Kprime",P->Kprime);
  (*f)(usr,"J",P->J);
  (*f)(usr,"L",P->L);
  (*f)(usr,"S",P->S);
  (*f)(usr,"H",P->H);
  (*f)(usr,"B",P->B);
  (*f)(usr,"W",P->W);
  (*f)(usr,"P",P->P);
  (*f)(usr,"P1",P->P1);
  (*f)(usr,"U",P->U);
  return;
}

Assistant:

void parameters_dump(const parameters* P, void* usr, parameter_print_func f)
{
#define pr(var)		do { (*f)(usr, #var, P->var); } while(0)
	pr(K);
	pr(Kprime);
	pr(J);
	pr(L);
	pr(S);
	pr(H);
	pr(B);
	pr(W);
	pr(P);
	pr(P1);
	pr(U);
#undef pr
}